

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_22_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_append_string_from_oct(&G->data,(G->data).literal_str,yytext,(long)yyleng);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_22_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_22_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            APPEND_OCT(yytext, yyleng);\n\
        }\n"));
  
            APPEND_OCT(yytext, yyleng);
        ;
#undef v
#undef k
#undef h
#undef e
}